

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressPNG.h
# Opt level: O0

void __thiscall adios2::core::compress::CompressPNG::~CompressPNG(CompressPNG *this)

{
  CompressPNG *in_RDI;
  
  ~CompressPNG(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

~CompressPNG() = default;